

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token,string *decoded)

{
  Location pCVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  Location end;
  uint uVar5;
  uint unicode;
  string local_68;
  Reader *local_48;
  Location local_40;
  uint local_34;
  
  std::__cxx11::string::reserve((ulong)decoded);
  end = token->end_ + -1;
  local_40 = token->start_ + 1;
  local_48 = this;
joined_r0x0010e85d:
  if (local_40 == end) {
    return true;
  }
  pCVar1 = local_40 + 1;
  cVar2 = *local_40;
  if (cVar2 != '\\') {
    local_40 = pCVar1;
    if (cVar2 == '\"') {
      return true;
    }
    goto LAB_0010e88f;
  }
  if (pCVar1 == end) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_40 = pCVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Empty escape sequence in string","");
    addError(local_48,&local_68,token,pCVar1);
    goto LAB_0010eada;
  }
  pCVar1 = local_40 + 2;
  bVar4 = local_40[1];
  local_40 = pCVar1;
  if (bVar4 < 0x62) {
    if (((bVar4 != 0x22) && (bVar4 != 0x2f)) && (bVar4 != 0x5c)) goto switchD_0010e8e8_caseD_6f;
    goto LAB_0010e88f;
  }
  switch(bVar4) {
  case 0x6e:
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
switchD_0010e8e8_caseD_6f:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Bad escape sequence in string","");
    addError(local_48,&local_68,token,pCVar1);
LAB_0010eada:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    return false;
  case 0x72:
    break;
  case 0x74:
    break;
  case 0x75:
    bVar3 = decodeUnicodeCodePoint(local_48,token,&local_40,end,&local_34);
    uVar5 = local_34;
    if (!bVar3) {
      return false;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    if (local_34 < 0x80) {
      std::__cxx11::string::resize((ulong)&local_68,'\x01');
LAB_0010ea6a:
      *local_68._M_dataplus._M_p = (char)uVar5;
    }
    else {
      bVar4 = (byte)local_34;
      if (local_34 < 0x800) {
        std::__cxx11::string::resize((ulong)&local_68,'\x02');
        local_68._M_dataplus._M_p[1] = bVar4 & 0x3f | 0x80;
        uVar5 = (uint)(byte)((byte)(uVar5 >> 6) | 0xc0);
        goto LAB_0010ea6a;
      }
      if (local_34 < 0x10000) {
        std::__cxx11::string::resize((ulong)&local_68,'\x03');
        local_68._M_dataplus._M_p[2] = bVar4 & 0x3f | 0x80;
        local_68._M_dataplus._M_p[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
        uVar5 = (uint)(byte)((byte)(uVar5 >> 0xc) | 0xe0);
        goto LAB_0010ea6a;
      }
      if (local_34 < 0x110000) {
        std::__cxx11::string::resize((ulong)&local_68,'\x04');
        local_68._M_dataplus._M_p[3] = bVar4 & 0x3f | 0x80;
        local_68._M_dataplus._M_p[2] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
        local_68._M_dataplus._M_p[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
        uVar5 = (uint)(byte)((byte)(uVar5 >> 0x12) | 0xf0);
        goto LAB_0010ea6a;
      }
    }
    std::__cxx11::string::_M_append((char *)decoded,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    goto joined_r0x0010e85d;
  default:
    if ((bVar4 != 0x62) && (bVar4 != 0x66)) goto switchD_0010e8e8_caseD_6f;
  }
LAB_0010e88f:
  pCVar1 = local_40;
  std::__cxx11::string::push_back((char)decoded);
  local_40 = pCVar1;
  goto joined_r0x0010e85d;
}

Assistant:

bool Reader::decodeString(Token& token, std::string& decoded) {
  decoded.reserve(token.end_ - token.start_ - 2);
  Location current = token.start_ + 1; // skip '"'
  Location end = token.end_ - 1;       // do not include '"'
  while (current != end) {
    Char c = *current++;
    if (c == '"')
      break;
    else if (c == '\\') {
      if (current == end)
        return addError("Empty escape sequence in string", token, current);
      Char escape = *current++;
      switch (escape) {
      case '"':
        decoded += '"';
        break;
      case '/':
        decoded += '/';
        break;
      case '\\':
        decoded += '\\';
        break;
      case 'b':
        decoded += '\b';
        break;
      case 'f':
        decoded += '\f';
        break;
      case 'n':
        decoded += '\n';
        break;
      case 'r':
        decoded += '\r';
        break;
      case 't':
        decoded += '\t';
        break;
      case 'u': {
        unsigned int unicode;
        if (!decodeUnicodeCodePoint(token, current, end, unicode))
          return false;
        decoded += codePointToUTF8(unicode);
      } break;
      default:
        return addError("Bad escape sequence in string", token, current);
      }
    } else {
      decoded += c;
    }
  }
  return true;
}